

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O2

RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl> * __thiscall
Diligent::RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl>::operator=
          (RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl> *this,
          PipelineResourceSignatureGLImpl *pObj)

{
  PipelineResourceSignatureGLImpl *this_00;
  
  this_00 = this->m_pObject;
  if (this_00 != pObj) {
    if (this_00 != (PipelineResourceSignatureGLImpl *)0x0) {
      DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
      ::Release((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
                 *)this_00);
    }
    this->m_pObject = pObj;
    if (pObj != (PipelineResourceSignatureGLImpl *)0x0) {
      RefCountedObject<Diligent::IPipelineResourceSignature>::AddRef
                ((RefCountedObject<Diligent::IPipelineResourceSignature> *)pObj);
    }
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(T* pObj) noexcept
    {
        if (m_pObject != pObj)
        {
            if (m_pObject)
                m_pObject->Release();
            m_pObject = pObj;
            if (m_pObject)
                m_pObject->AddRef();
        }
        return *this;
    }